

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void vm_init(VM *vm)

{
  mapped_type *ppvVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  *this;
  allocator local_29;
  key_type local_28;
  
  std::__cxx11::string::string
            ((string *)&local_28,"global\\int\\+\\(global\\int\\\\global\\int\\*\\)global\\int\\",
             &local_29);
  this = &vm->overrides;
  ppvVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_28);
  *ppvVar1 = x86_add;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string
            ((string *)&local_28,"global\\int\\-\\(global\\int\\\\global\\int\\*\\)global\\int\\",
             &local_29);
  ppvVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_28);
  *ppvVar1 = x86_sub;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string
            ((string *)&local_28,"global\\int\\*\\(global\\int\\\\global\\int\\*\\)global\\int\\",
             &local_29);
  ppvVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_28);
  *ppvVar1 = x86_mul;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string
            ((string *)&local_28,"global\\int\\/\\(global\\int\\\\global\\int\\*\\)global\\int\\",
             &local_29);
  ppvVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_28);
  *ppvVar1 = x86_div;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string
            ((string *)&local_28,"global\\int\\<\\(global\\int\\\\global\\int\\*\\)global\\bool\\",
             &local_29);
  ppvVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_28);
  *ppvVar1 = x86_lt;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string
            ((string *)&local_28,"global\\int\\>\\(global\\int\\\\global\\int\\*\\)global\\bool\\",
             &local_29);
  ppvVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_28);
  *ppvVar1 = x86_gt;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"global\\print\\(global\\int\\\\)",&local_29);
  ppvVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_28);
  *ppvVar1 = print;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"global\\print\\(global\\bool\\\\)",&local_29);
  ppvVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_28);
  *ppvVar1 = print_bool;
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void vm_init(VM* vm) {
  vm->addOverride("global\\int\\+\\(global\\int\\\\global\\int\\*\\)global\\int\\",(void*)&x86_add);
  vm->addOverride("global\\int\\-\\(global\\int\\\\global\\int\\*\\)global\\int\\",(void*)&x86_sub);
  vm->addOverride("global\\int\\*\\(global\\int\\\\global\\int\\*\\)global\\int\\",(void*)&x86_mul);
  vm->addOverride("global\\int\\/\\(global\\int\\\\global\\int\\*\\)global\\int\\",(void*)&x86_div);
  vm->addOverride("global\\int\\<\\(global\\int\\\\global\\int\\*\\)global\\bool\\",(void*)&x86_lt);
  vm->addOverride("global\\int\\>\\(global\\int\\\\global\\int\\*\\)global\\bool\\",(void*)&x86_gt);
  vm->addOverride("global\\print\\(global\\int\\\\)",(void*)&print);
  vm->addOverride("global\\print\\(global\\bool\\\\)",(void*)&print_bool);
  
}